

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findMetadataFunctionNames.cpp
# Opt level: O0

void findMetadataFunctionNames(Module *module,Program *program)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  Func *pFVar5;
  Function *pFVar6;
  ret_type this;
  Program *in_RSI;
  undefined1 auVar7 [16];
  StringRef SVar8;
  StringRef SVar9;
  regex varName;
  DILocalVariable *localVar;
  Metadata *varMD;
  ret_type CI;
  Instruction *ins;
  const_iterator __end3;
  const_iterator __begin3;
  BasicBlock *__range3;
  BasicBlock *block;
  const_iterator __end2;
  const_iterator __begin2;
  Function *__range2;
  Func *function;
  Function *func;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
  __end1;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
  __begin1;
  iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>_>
  *__range1;
  Func *in_stack_fffffffffffffe58;
  size_t in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe68;
  undefined7 in_stack_fffffffffffffe70;
  byte in_stack_fffffffffffffe77;
  Function *in_stack_fffffffffffffe80;
  undefined6 in_stack_fffffffffffffe88;
  byte in_stack_fffffffffffffe8e;
  undefined1 in_stack_fffffffffffffe8f;
  char *in_stack_fffffffffffffe98;
  size_t in_stack_fffffffffffffea0;
  StringRef SVar10;
  string local_158 [48];
  Function *local_128;
  size_t local_120;
  string local_118 [64];
  ret_type local_d8;
  Metadata *local_d0;
  byte local_c1;
  undefined1 local_c0 [16];
  string local_b0 [32];
  ret_type local_90;
  reference local_88;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
  local_80;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
  local_78;
  reference local_70;
  reference local_68;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
  local_60;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
  local_58;
  reference local_50;
  Func *local_48;
  reference local_40;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
  local_38;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
  local_30;
  iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>_>
  local_28;
  iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>_>
  *local_18;
  Program *local_10;
  
  local_10 = in_RSI;
  local_28 = llvm::Module::functions
                       ((Module *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
  local_18 = &local_28;
  local_30 = llvm::
             iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>_>
             ::begin(local_18);
  local_38 = llvm::
             iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>_>
             ::end(local_18);
  SVar10.Length = in_stack_fffffffffffffea0;
  SVar10.Data = in_stack_fffffffffffffe98;
  SVar9.Length = in_stack_fffffffffffffe60;
  SVar9.Data = in_stack_fffffffffffffe68;
  while( true ) {
    bVar1 = llvm::operator!=(&local_30,&local_38);
    if (!bVar1) break;
    local_40 = llvm::
               ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
               ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
                            *)0x28e6f9);
    uVar4 = llvm::GlobalValue::isDeclaration();
    if ((uVar4 & 1) == 0) {
      pFVar5 = Program::getFunction
                         ((Program *)
                          CONCAT17(in_stack_fffffffffffffe8f,
                                   CONCAT16(in_stack_fffffffffffffe8e,in_stack_fffffffffffffe88)),
                          in_stack_fffffffffffffe80);
      local_48 = pFVar5;
      Program::getGlobalVarNames_abi_cxx11_(local_10);
      Func::
      fillMetadataVarNames<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                ((Func *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)SVar9.Data);
      local_50 = local_40;
      local_58.NodePtr = (node_pointer)llvm::Function::begin((Function *)in_stack_fffffffffffffe58);
      local_60.NodePtr = (node_pointer)llvm::Function::end((Function *)in_stack_fffffffffffffe58);
      while( true ) {
        bVar1 = llvm::operator!=(&local_58,&local_60);
        if (!bVar1) break;
        local_70 = llvm::
                   ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
                   ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
                                *)0x28e7c2);
        local_68 = local_70;
        local_78.NodePtr =
             (node_pointer)llvm::BasicBlock::begin((BasicBlock *)in_stack_fffffffffffffe58);
        local_80.NodePtr =
             (node_pointer)llvm::BasicBlock::end((BasicBlock *)in_stack_fffffffffffffe58);
        while( true ) {
          bVar1 = llvm::operator!=(&local_78,&local_80);
          if (!bVar1) break;
          local_88 = llvm::
                     ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
                     ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
                                  *)0x28e82f);
          uVar2 = llvm::Instruction::getOpcode((Instruction *)0x28e844);
          if (uVar2 == 0x38) {
            local_90 = llvm::cast<llvm::CallInst,llvm::Instruction_const>((Instruction *)0x28e85a);
            pFVar6 = llvm::CallBase::getCalledFunction((CallBase *)SVar9.Data);
            local_c1 = 0;
            in_stack_fffffffffffffe8e = false;
            if (pFVar6 != (Function *)0x0) {
              llvm::CallBase::getCalledFunction((CallBase *)SVar9.Data);
              auVar7 = llvm::Value::getName();
              local_c0 = auVar7;
              llvm::StringRef::str_abi_cxx11_((StringRef *)SVar10.Data);
              local_c1 = 1;
              iVar3 = std::__cxx11::string::compare((char *)local_b0);
              in_stack_fffffffffffffe8e = iVar3 == 0;
            }
            in_stack_fffffffffffffe8f = in_stack_fffffffffffffe8e;
            if ((local_c1 & 1) != 0) {
              std::__cxx11::string::~string(local_b0);
            }
            if ((in_stack_fffffffffffffe8e & 1) != 0) {
              llvm::User::getOperand
                        ((User *)SVar9.Length,(uint)((ulong)in_stack_fffffffffffffe58 >> 0x20));
              this = llvm::dyn_cast_or_null<llvm::MetadataAsValue,llvm::Value>
                               ((Value *)SVar9.Length);
              local_d0 = llvm::MetadataAsValue::getMetadata(this);
              local_d8 = llvm::dyn_cast_or_null<llvm::DILocalVariable,llvm::Metadata>
                                   ((Metadata *)SVar9.Length);
              std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                        ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)SVar10.Length,
                         SVar10.Data,(flag_type)((ulong)pFVar5 >> 0x20));
              SVar8 = llvm::DIVariable::getName((DIVariable *)0x28e979);
              local_120 = SVar8.Length;
              in_stack_fffffffffffffe80 = (Function *)SVar8.Data;
              local_128 = in_stack_fffffffffffffe80;
              llvm::StringRef::str_abi_cxx11_((StringRef *)SVar10.Data);
              in_stack_fffffffffffffe77 =
                   std::
                   regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                              (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)SVar9.Data,
                              SVar9.Length._4_4_);
              std::__cxx11::string::~string(local_118);
              if ((in_stack_fffffffffffffe77 & 1) != 0) {
                in_stack_fffffffffffffe58 = local_48;
                SVar9 = llvm::DIVariable::getName((DIVariable *)0x28ea06);
                SVar10 = SVar9;
                llvm::StringRef::str_abi_cxx11_((StringRef *)SVar9.Data);
                Func::addMetadataVarName
                          ((Func *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                           (string *)SVar9.Data);
                std::__cxx11::string::~string(local_158);
              }
              std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                        ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)SVar9.Length);
            }
          }
          llvm::
          ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
          ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
                        *)SVar9.Length);
        }
        llvm::
        ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
        ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
                      *)SVar9.Length);
      }
    }
    llvm::
    ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
    ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
                  *)SVar9.Length);
  }
  Program::addPass((Program *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                   SVar9.Data._4_4_);
  return;
}

Assistant:

void findMetadataFunctionNames(const llvm::Module* module, Program& program) {
    assert(program.isPassCompleted(PassType::CreateFunctions));

    for (const llvm::Function& func : module->functions()) {
        if (func.isDeclaration())
            continue;

        auto function = program.getFunction(&func);
        assert(function && "Do not have function");

        function->fillMetadataVarNames(program.getGlobalVarNames());

        for (const llvm::BasicBlock& block : func) {
            for (const llvm::Instruction& ins : block) {
                if (ins.getOpcode() == llvm::Instruction::Call) {
                    const auto CI = llvm::cast<llvm::CallInst>(&ins);
                    if (CI->getCalledFunction() && CI->getCalledFunction()->getName().str().compare("llvm.dbg.declare") == 0) {
                        llvm::Metadata* varMD = llvm::dyn_cast_or_null<llvm::MetadataAsValue>(ins.getOperand(1))->getMetadata();
                        llvm::DILocalVariable* localVar = llvm::dyn_cast_or_null<llvm::DILocalVariable>(varMD);

                        std::regex varName("var[0-9]+");
                        if (std::regex_match(localVar->getName().str(), varName)) {
                            function->addMetadataVarName(localVar->getName().str());
                        }
                    }
                }
            }
        }
    }

    program.addPass(PassType::FindMetadataFunctionNames);
}